

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeFunctionCall(ExpressionContext *ctx,SynFunctionCall *syntax)

{
  Allocator *pAVar1;
  InplaceStr name;
  undefined1 auVar2 [16];
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  IntrusiveList<TypeHandle> generics_02;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ExprBase *value;
  TypeBase *pTVar6;
  undefined4 extraout_var;
  long lVar7;
  _func_int **pp_Var8;
  ExprBase *pEVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ExprBase *pEVar10;
  undefined4 extraout_var_02;
  ExprSequence *pEVar11;
  VariableData *variable;
  ExprBase *pEVar12;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ExprSequence *this;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  SynIdentifier *pSVar13;
  ExprBase **ppEVar14;
  char *pcVar15;
  SynBase *pSVar16;
  SynCallArgument *pSVar17;
  SynCallArgument *pSVar18;
  SynBase *pSVar19;
  bool bVar20;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  IntrusiveList<SynIdentifier> path;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<FunctionValue> functions_02;
  ArrayView<FunctionValue> functions_03;
  ArrayView<FunctionValue> functions_04;
  ArrayView<FunctionValue> functions_05;
  IntrusiveList<ExprBase> arguments_2;
  IntrusiveList<TypeHandle> generics;
  ExprBase *call;
  ExprBase *definition;
  SmallArray<FunctionValue,_32U> functions;
  SmallArray<ArgumentData,_16U> arguments;
  undefined1 local_6f8 [32];
  ExprBase *local_6d8;
  Allocator *local_6d0;
  IntrusiveList<TypeHandle> local_6c8;
  ExprBase *local_6b8;
  ExprBase *local_6b0;
  TypeBase *local_6a8;
  ArgumentData *local_6a0;
  uint uStack_698;
  undefined4 uStack_694;
  ArgumentData *local_690;
  uint uStack_688;
  undefined4 uStack_684;
  ArgumentData *local_680;
  uint uStack_678;
  undefined4 uStack_674;
  ExprBase *local_670;
  undefined1 local_668 [784];
  Allocator *local_358;
  undefined1 auStack_350 [8];
  SmallArray<ArgumentData,_16U> local_348;
  TypeHandle *node;
  undefined4 extraout_var_03;
  
  value = AnalyzeExpression(ctx,syntax->value);
  if ((value->type != (TypeBase *)0x0) && (value->type->typeID == 0)) {
    local_668._0_8_ = (ExprBase *)0x0;
    local_668._8_4_ = 0;
    local_668._12_4_ = 0;
    pSVar18 = (syntax->arguments).head;
    if (pSVar18 != (SynCallArgument *)0x0) {
      do {
        pEVar10 = AnalyzeExpression(ctx,pSVar18->value);
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)local_668,pEVar10);
        pSVar18 = (SynCallArgument *)(pSVar18->super_SynBase).next;
        if ((pSVar18 == (SynCallArgument *)0x0) || ((pSVar18->super_SynBase).typeID != 0x18)) {
          pSVar18 = (SynCallArgument *)0x0;
        }
      } while (pSVar18 != (SynCallArgument *)0x0);
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar10->typeID = 0x29;
    pEVar10->source = &syntax->super_SynBase;
    pEVar10->type = pTVar6;
    pEVar10->next = (ExprBase *)0x0;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229f28;
    pEVar10[1]._vptr_ExprBase = (_func_int **)value;
    *(undefined8 *)&pEVar10[1].typeID = local_668._0_8_;
    pEVar10[1].source = (SynBase *)CONCAT44(local_668._12_4_,local_668._8_4_);
    return pEVar10;
  }
  local_6c8.head = (TypeHandle *)0x0;
  local_6c8.tail = (TypeHandle *)0x0;
  pSVar16 = (syntax->aliases).head;
  if (pSVar16 != (SynBase *)0x0) {
    do {
      pTVar6 = AnalyzeType(ctx,pSVar16,true,(bool *)0x0);
      if (pTVar6 == ctx->typeAuto) {
        pcVar15 = "ERROR: explicit generic argument type can\'t be auto";
LAB_0016670a:
        anon_unknown.dwarf_9fd58::Stop(ctx,&syntax->super_SynBase,pcVar15);
      }
      if (pTVar6 == ctx->typeVoid) {
        pcVar15 = "ERROR: explicit generic argument cannot be a void type";
        goto LAB_0016670a;
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      node = (TypeHandle *)CONCAT44(extraout_var,iVar4);
      node->type = pTVar6;
      node->next = (TypeHandle *)0x0;
      node->listed = false;
      IntrusiveList<TypeHandle>::push_back(&local_6c8,node);
      pSVar16 = pSVar16->next;
    } while (pSVar16 != (SynBase *)0x0);
  }
  pAVar1 = ctx->allocator;
  this = (ExprSequence *)(local_668 + 0x10);
  memset(this,0,0x300);
  local_668._8_4_ = 0;
  local_668._12_4_ = 0x20;
  lVar7 = 0x20;
  do {
    *(undefined8 *)(auStack_350 + lVar7 + -8) = 0;
    auStack_350[lVar7] = 0;
    *(undefined8 *)((long)local_348.little + lVar7 + -0x10) = 0;
    *(undefined8 *)((long)local_348.little + lVar7 + -8) = 0;
    *(undefined8 *)((long)&local_348.little[0].source + lVar7) = 0;
    *(undefined8 *)(&local_348.little[0].isExplicit + lVar7) = 0;
    lVar7 = lVar7 + 0x30;
  } while (lVar7 != 800);
  local_348.data = local_348.little;
  local_348.count = 0;
  local_348.max = 0x10;
  if ((value == (ExprBase *)0x0) || (pEVar10 = value, value->typeID != 8)) {
    pEVar10 = (ExprBase *)0x0;
  }
  local_668._0_8_ = this;
  local_358 = pAVar1;
  local_348.allocator = pAVar1;
  if (pEVar10 == (ExprBase *)0x0) {
    bVar20 = true;
    goto LAB_001664b7;
  }
  pp_Var8 = pEVar10[1]._vptr_ExprBase;
  if ((pp_Var8 == (_func_int **)0x0) || (*(int *)(pp_Var8 + 1) != 0x18)) {
    pp_Var8 = (_func_int **)0x0;
  }
  bVar20 = true;
  if ((pp_Var8 != (_func_int **)0x0) && (*(char *)(pp_Var8 + 0x24) == '\0')) {
    anon_unknown.dwarf_9fd58::Report
              (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not fully defined");
    local_6f8._0_8_ = (ExprBase *)0x0;
    local_6f8._8_4_ = 0;
    local_6f8._12_4_ = 0;
    pSVar18 = (syntax->arguments).head;
    if (pSVar18 != (SynCallArgument *)0x0) {
      do {
        pEVar9 = AnalyzeExpression(ctx,pSVar18->value);
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)local_6f8,pEVar9);
        pSVar18 = (SynCallArgument *)(pSVar18->super_SynBase).next;
        if ((pSVar18 == (SynCallArgument *)0x0) || ((pSVar18->super_SynBase).typeID != 0x18)) {
          pSVar18 = (SynCallArgument *)0x0;
        }
      } while (pSVar18 != (SynCallArgument *)0x0);
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (ExprSequence *)CONCAT44(extraout_var_00,iVar4);
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    (this->super_ExprBase).typeID = 0x29;
    (this->super_ExprBase).source = &syntax->super_SynBase;
    (this->super_ExprBase).type = pTVar6;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229f28;
    (this->expressions).data = (ExprBase **)value;
    (this->expressions).count = local_6f8._0_4_;
    (this->expressions).max = local_6f8._4_4_;
    (this->expressions).little[0] = (ExprBase *)CONCAT44(local_6f8._12_4_,local_6f8._8_4_);
    bVar20 = false;
  }
  if (bVar20) {
    pSVar13 = (SynIdentifier *)pEVar10[1]._vptr_ExprBase;
    if (pSVar13 == (SynIdentifier *)0x0) {
LAB_00165f5f:
      pSVar13 = (SynIdentifier *)0x0;
    }
    else {
      if ((pSVar13->super_SynBase).typeID == 0) {
        local_6f8._0_8_ = (ExprBase *)0x0;
        local_6f8._8_4_ = 0;
        local_6f8._12_4_ = 0;
        pSVar18 = (syntax->arguments).head;
        if (pSVar18 != (SynCallArgument *)0x0) {
          do {
            pEVar10 = AnalyzeExpression(ctx,pSVar18->value);
            IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)local_6f8,pEVar10);
            pSVar18 = (SynCallArgument *)(pSVar18->super_SynBase).next;
            if ((pSVar18 == (SynCallArgument *)0x0) || ((pSVar18->super_SynBase).typeID != 0x18)) {
              pSVar18 = (SynCallArgument *)0x0;
            }
          } while (pSVar18 != (SynCallArgument *)0x0);
        }
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        this = (ExprSequence *)CONCAT44(extraout_var_02,iVar4);
        pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        (this->super_ExprBase).typeID = 0x29;
        (this->super_ExprBase).source = &syntax->super_SynBase;
        (this->super_ExprBase).type = pTVar6;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229f28;
        (this->expressions).data = (ExprBase **)value;
        (this->expressions).count = local_6f8._0_4_;
        (this->expressions).max = local_6f8._4_4_;
        (this->expressions).little[0] = (ExprBase *)CONCAT44(local_6f8._12_4_,local_6f8._8_4_);
        goto LAB_001664b5;
      }
      if ((pSVar13 == (SynIdentifier *)0x0) || ((pSVar13->super_SynBase).typeID != 0x1c))
      goto LAB_00165f5f;
    }
    bVar20 = true;
    if (((pSVar13 != (SynIdentifier *)0x0) && (local_6c8.head == (TypeHandle *)0x0)) &&
       (pSVar18 = (syntax->arguments).head, pSVar18 != (SynCallArgument *)0x0)) {
      iVar4 = 1;
      pSVar17 = pSVar18;
      do {
        pSVar17 = (SynCallArgument *)(pSVar17->super_SynBase).next;
        iVar4 = iVar4 + -1;
      } while (pSVar17 != (SynCallArgument *)0x0);
      if ((iVar4 == 0) && (pSVar18->name == (SynIdentifier *)0x0)) {
        pSVar16 = pSVar18->value;
        if ((pSVar16 == (SynBase *)0x0) || (pSVar16->typeID != 7)) {
          pSVar16 = (SynBase *)0x0;
        }
        if ((pSVar16 != (SynBase *)0x0) && (pSVar16[1]._vptr_SynBase == (_func_int **)0x0)) {
          pcVar15 = pSVar13[1].super_SynBase.begin[3].pos;
          bVar20 = pcVar15 == (char *)0x0;
          if (!bVar20) {
            lVar7 = *(long *)(*(long *)(pcVar15 + 8) + 0x28);
            while (bVar3 = InplaceStr::operator==
                                     ((InplaceStr *)(lVar7 + 0x40),(InplaceStr *)&pSVar16[1].begin),
                  !bVar3) {
              pcVar15 = *(char **)(pcVar15 + 0x18);
              bVar20 = pcVar15 == (char *)0x0;
              if (bVar20) goto LAB_001666a4;
              lVar7 = *(long *)(*(long *)(pcVar15 + 8) + 0x28);
            }
            iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
            this = (ExprSequence *)CONCAT44(extraout_var_07,iVar4);
            pTVar6 = ctx->typeBool;
            (this->super_ExprBase).typeID = 3;
            (this->super_ExprBase).source = &syntax->super_SynBase;
            (this->super_ExprBase).type = pTVar6;
            (this->super_ExprBase).next = (ExprBase *)0x0;
            *(undefined2 *)&(this->super_ExprBase).listed = 0x100;
            (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002294a0;
          }
LAB_001666a4:
          if (bVar20) {
            iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
            this = (ExprSequence *)CONCAT44(extraout_var_08,iVar4);
            pTVar6 = ctx->typeBool;
            (this->super_ExprBase).typeID = 3;
            (this->super_ExprBase).source = &syntax->super_SynBase;
            (this->super_ExprBase).type = pTVar6;
            (this->super_ExprBase).next = (ExprBase *)0x0;
            *(undefined2 *)&(this->super_ExprBase).listed = 0;
            (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002294a0;
          }
          bVar20 = false;
        }
      }
    }
    if (bVar20) {
      pSVar16 = syntax->value;
      if ((pSVar16 == (SynBase *)0x0) || (pSVar19 = pSVar16, pSVar16->typeID != 7)) {
        pSVar19 = (SynBase *)0x0;
      }
      if (pSVar19 == (SynBase *)0x0) {
LAB_00166125:
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pSVar13;
        pEVar9 = CreateVariableAccess
                           (ctx,pSVar16,(IntrusiveList<SynIdentifier>)(auVar2 << 0x40),
                            *(InplaceStr *)(pEVar10[1]._vptr_ExprBase + 2),false);
      }
      else {
        name.begin = (char *)pSVar19[1].begin;
        name.end = (char *)pSVar19[1].end;
        path.tail = pSVar13;
        path.head = (SynIdentifier *)pSVar19[1]._vptr_SynBase;
        pEVar9 = CreateVariableAccess(ctx,pSVar16,path,name,false);
        if (pEVar9 == (ExprBase *)0x0) {
          if (pSVar19[1]._vptr_SynBase == (_func_int **)0x0) {
            pSVar16 = syntax->value;
            goto LAB_00166125;
          }
          pEVar9 = (ExprBase *)0x0;
        }
      }
      if (pEVar9 != (ExprBase *)0x0) {
        local_668._8_4_ = 0;
        GetNodeFunctions(ctx,&syntax->super_SynBase,pEVar9,
                         (SmallArray<FunctionValue,_32U> *)local_668);
        bVar20 = true;
        if (local_668._8_4_ != 0) {
          ppEVar14 = (ExprBase **)&((ExprBase *)local_668._0_8_)->typeID;
          uVar5 = local_668._8_4_;
          do {
            if (*(TypeBase **)(*(long *)&(*ppEVar14)->listed + 0x60) != ctx->typeVoid) {
              if (local_348.count == 0) {
                AnalyzeFunctionArgumentsEarly(ctx,(syntax->arguments).head,&local_348);
              }
              functions_00.count = local_668._8_4_;
              functions_00.data = (FunctionValue *)local_668._0_8_;
              functions_00._12_4_ = 0;
              AnalyzeFunctionArgumentsFinal
                        (ctx,&syntax->super_SynBase,value,functions_00,(syntax->arguments).head,
                         &local_348);
              functions_01.count = local_668._8_4_;
              functions_01.data = (FunctionValue *)local_668._0_8_;
              local_680 = local_348.data;
              uStack_678 = local_348.count;
              arguments_00._12_4_ = uStack_674;
              arguments_00.count = local_348.count;
              generics_00.tail = local_6c8.tail;
              generics_00.head = local_6c8.head;
              arguments_00.data = local_348.data;
              functions_01._12_4_ = 0;
              pEVar11 = (ExprSequence *)
                        CreateFunctionCallFinal
                                  (ctx,&syntax->super_SynBase,value,functions_01,generics_00,
                                   arguments_00,true);
              bVar20 = pEVar11 == (ExprSequence *)0x0;
              if (!bVar20) {
                this = pEVar11;
              }
              break;
            }
            ppEVar14 = ppEVar14 + 3;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        if (!bVar20) goto LAB_001664b5;
      }
      bVar20 = true;
      if (((TypeBase *)pEVar10[1]._vptr_ExprBase)->isGeneric != false) goto LAB_001664b7;
      variable = anon_unknown.dwarf_9fd58::AllocateTemporary
                           (ctx,&syntax->super_SynBase,(TypeBase *)pEVar10[1]._vptr_ExprBase);
      pEVar9 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
      pEVar9 = CreateGetAddress(ctx,&syntax->super_SynBase,pEVar9);
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar12 = (ExprBase *)CONCAT44(extraout_var_03,iVar4);
      local_6a8 = ctx->typeVoid;
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
      pp_Var8 = (_func_int **)CONCAT44(extraout_var_04,iVar4);
      *pp_Var8 = (_func_int *)0x0;
      pp_Var8[1] = (_func_int *)variable;
      pp_Var8[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var8 + 3) = 0;
      pEVar12->typeID = 0x1e;
      pEVar12->source = &syntax->super_SynBase;
      pEVar12->type = local_6a8;
      pEVar12->next = (ExprBase *)0x0;
      pEVar12->listed = false;
      pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a58;
      pEVar12[1]._vptr_ExprBase = pp_Var8;
      *(undefined8 *)&pEVar12[1].typeID = 0;
      local_6b0 = pEVar12;
      pEVar9 = CreateConstructorAccess
                         (ctx,&syntax->super_SynBase,(TypeBase *)pEVar10[1]._vptr_ExprBase,
                          (syntax->arguments).head == (SynCallArgument *)0x0,pEVar9);
      if (pEVar9 == (ExprBase *)0x0) {
        bVar20 = true;
        if ((syntax->arguments).head != (SynCallArgument *)0x0) goto LAB_001664b7;
        local_6d8 = (ExprBase *)ctx->allocator;
        local_6f8._0_8_ = local_6f8 + 0x10;
        local_6f8._8_4_ = 0;
        local_6f8._12_4_ = 2;
        SmallArray<ExprBase_*,_2U>::push_back((SmallArray<ExprBase_*,_2U> *)local_6f8,&local_6b0);
        local_6b8 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
        SmallArray<ExprBase_*,_2U>::push_back((SmallArray<ExprBase_*,_2U> *)local_6f8,&local_6b8);
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (ExprSequence *)CONCAT44(extraout_var_06,iVar4);
        arr_00.count = local_6f8._8_4_;
        arr_00.data = (ExprBase **)local_6f8._0_8_;
        arr_00._12_4_ = 0;
        ExprSequence::ExprSequence
                  (this,ctx->allocator,&syntax->super_SynBase,(TypeBase *)pEVar10[1]._vptr_ExprBase,
                   arr_00);
        SmallArray<ExprBase_*,_2U>::~SmallArray((SmallArray<ExprBase_*,_2U> *)local_6f8);
      }
      else {
        local_668._8_4_ = 0;
        GetNodeFunctions(ctx,&syntax->super_SynBase,pEVar9,
                         (SmallArray<FunctionValue,_32U> *)local_668);
        if (local_348.count == 0) {
          AnalyzeFunctionArgumentsEarly(ctx,(syntax->arguments).head,&local_348);
        }
        functions_02.count = local_668._8_4_;
        functions_02.data = (FunctionValue *)local_668._0_8_;
        functions_02._12_4_ = 0;
        AnalyzeFunctionArgumentsFinal
                  (ctx,&syntax->super_SynBase,value,functions_02,(syntax->arguments).head,&local_348
                  );
        functions_03.count = local_668._8_4_;
        functions_03.data = (FunctionValue *)local_668._0_8_;
        local_690 = local_348.data;
        uStack_688 = local_348.count;
        arguments_01._12_4_ = uStack_684;
        arguments_01.count = local_348.count;
        generics_01.tail = local_6c8.tail;
        generics_01.head = local_6c8.head;
        arguments_01.data = local_348.data;
        functions_03._12_4_ = 0;
        local_6b8 = CreateFunctionCallFinal
                              (ctx,&syntax->super_SynBase,value,functions_03,generics_01,
                               arguments_01,false);
        local_6d0 = ctx->allocator;
        local_6f8._0_8_ = local_6f8 + 0x10;
        local_6f8._8_4_ = 0;
        local_6f8._12_4_ = 3;
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_6f8,&local_6b0);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_6f8,&local_6b8);
        local_670 = CreateVariableAccess(ctx,&syntax->super_SynBase,variable,false);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_6f8,&local_670);
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        this = (ExprSequence *)CONCAT44(extraout_var_05,iVar4);
        arr.count = local_6f8._8_4_;
        arr.data = (ExprBase **)local_6f8._0_8_;
        arr._12_4_ = 0;
        ExprSequence::ExprSequence
                  (this,ctx->allocator,&syntax->super_SynBase,(TypeBase *)pEVar10[1]._vptr_ExprBase,
                   arr);
        SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_6f8);
      }
    }
  }
LAB_001664b5:
  bVar20 = false;
LAB_001664b7:
  if (bVar20) {
    local_668._8_4_ = 0;
    GetNodeFunctions(ctx,&syntax->super_SynBase,value,(SmallArray<FunctionValue,_32U> *)local_668);
    if (local_348.count == 0) {
      AnalyzeFunctionArgumentsEarly(ctx,(syntax->arguments).head,&local_348);
    }
    functions_04.count = local_668._8_4_;
    functions_04.data = (FunctionValue *)local_668._0_8_;
    functions_04._12_4_ = 0;
    AnalyzeFunctionArgumentsFinal
              (ctx,&syntax->super_SynBase,value,functions_04,(syntax->arguments).head,&local_348);
    functions_05.count = local_668._8_4_;
    functions_05.data = (FunctionValue *)local_668._0_8_;
    local_6a0 = local_348.data;
    uStack_698 = local_348.count;
    arguments_02._12_4_ = uStack_694;
    arguments_02.count = local_348.count;
    generics_02.tail = local_6c8.tail;
    generics_02.head = local_6c8.head;
    arguments_02.data = local_348.data;
    functions_05._12_4_ = 0;
    this = (ExprSequence *)
           CreateFunctionCallFinal
                     (ctx,&syntax->super_SynBase,value,functions_05,generics_02,arguments_02,false);
  }
  SmallArray<ArgumentData,_16U>::~SmallArray(&local_348);
  SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_668);
  return &this->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeFunctionCall(ExpressionContext &ctx, SynFunctionCall *syntax)
{
	ExprBase *function = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(function->type))
	{
		IntrusiveList<ExprBase> arguments;

		for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
			arguments.push_back(AnalyzeExpression(ctx, el->value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
	}

	IntrusiveList<TypeHandle> generics;

	for(SynBase *curr = syntax->aliases.head; curr; curr = curr->next)
	{
		TypeBase *type = AnalyzeType(ctx, curr);

		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: explicit generic argument type can't be auto");

		if(type == ctx.typeVoid)
			Stop(ctx, syntax, "ERROR: explicit generic argument cannot be a void type");

		generics.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
	}

	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);
	SmallArray<ArgumentData, 16> arguments(ctx.allocator);

	if(ExprTypeLiteral *type = getType<ExprTypeLiteral>(function))
	{
		if(TypeClass *typeClass = getType<TypeClass>(type->value))
		{
			if(!typeClass->completed)
			{
				Report(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(typeClass->name));

				IntrusiveList<ExprBase> arguments;

				for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
					arguments.push_back(AnalyzeExpression(ctx, el->value));

				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
			}
		}

		if(isType<TypeError>(type->value))
		{
			IntrusiveList<ExprBase> arguments;

			for(SynCallArgument *el = syntax->arguments.head; el; el = getType<SynCallArgument>(el->next))
				arguments.push_back(AnalyzeExpression(ctx, el->value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(syntax, ctx.GetErrorType(), function, arguments);
		}

		// Handle hasMember(x) expresion
		if(TypeMemberSet *memberSet = getType<TypeMemberSet>(type->value))
		{
			if(generics.empty() && syntax->arguments.size() == 1 && !syntax->arguments.head->name)
			{
				if(SynTypeSimple *name = getType<SynTypeSimple>(syntax->arguments.head->value))
				{
					if(name->path.empty())
					{
						for(MemberHandle *curr = memberSet->type->members.head; curr; curr = curr->next)
						{
							if(curr->variable->name->name == name->name)
								return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(syntax, ctx.typeBool, true);
						}

						return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(syntax, ctx.typeBool, false);
					}
				}
			}
		}

		ExprBase *regular = NULL;

		if(SynTypeSimple *node = getType<SynTypeSimple>(syntax->value))
		{
			regular = CreateVariableAccess(ctx, syntax->value, node->path, node->name, false);

			if(!regular && node->path.empty())
				regular = CreateVariableAccess(ctx, syntax->value, IntrusiveList<SynIdentifier>(), type->value->name, false);
		}
		else
		{
			regular = CreateVariableAccess(ctx, syntax->value, IntrusiveList<SynIdentifier>(), type->value->name, false);
		}

		if(regular)
		{
			// Collect a set of available functions
			functions.clear();
			GetNodeFunctions(ctx, syntax, regular, functions);

			// If only constructors are available, do not call as a regular function
			bool hasReturnValue = false;

			for(unsigned i = 0; i < functions.size(); i++)
			{
				if(functions[i].function->type->returnType != ctx.typeVoid)
				{
					hasReturnValue = true;
					break;
				}
			}

			if(hasReturnValue)
			{
				if(arguments.empty())
					AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

				AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

				ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, true);

				if(call)
					return call;
			}
		}

		if(!type->value->isGeneric)
		{
			VariableData *variable = AllocateTemporary(ctx, syntax, type->value);

			ExprBase *pointer = CreateGetAddress(ctx, syntax, CreateVariableAccess(ctx, syntax, variable, false));

			ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), NULL);

			ExprBase *constructor = CreateConstructorAccess(ctx, syntax, type->value, syntax->arguments.empty(), pointer);

			if(!constructor && syntax->arguments.empty())
			{
				SmallArray<ExprBase*, 2> expressions(ctx.allocator);

				expressions.push_back(definition);
				expressions.push_back(CreateVariableAccess(ctx, syntax, variable, false));

				return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, type->value, expressions);
			}

			if(constructor)
			{
				// Collect a set of available functions
				functions.clear();
				GetNodeFunctions(ctx, syntax, constructor, functions);

				if(arguments.empty())
					AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

				AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

				ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, false);

				SmallArray<ExprBase*, 3> expressions(ctx.allocator);

				expressions.push_back(definition);
				expressions.push_back(call);
				expressions.push_back(CreateVariableAccess(ctx, syntax, variable, false));

				return new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, type->value, expressions);
			}
		}
	}

	// Collect a set of available functions
	functions.clear();
	GetNodeFunctions(ctx, syntax, function, functions);

	if(arguments.empty())
		AnalyzeFunctionArgumentsEarly(ctx, syntax->arguments.head, arguments);

	AnalyzeFunctionArgumentsFinal(ctx, syntax, function, functions, syntax->arguments.head, arguments);

	return CreateFunctionCallFinal(ctx, syntax, function, functions, generics, arguments, false);
}